

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O1

void clear_save_pos_for_undo_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object obj;
  Am_Value value;
  Am_Object parent;
  Am_Object local_30;
  Am_Value local_28;
  Am_Object local_18;
  
  local_30.data = (Am_Object_Data *)0x0;
  local_18.data = (Am_Object_Data *)0x0;
  local_28.type = 0;
  local_28.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::operator=(&local_30,command_obj);
  do {
    in_value = Am_Object::Get(&local_30,0x154,1);
    Am_Value::operator=(&local_28,in_value);
    bVar1 = Am_Value::Valid(&local_28);
    if (!bVar1) {
LAB_0024a1f0:
      Am_Value::~Am_Value(&local_28);
      Am_Object::~Am_Object(&local_18);
      Am_Object::~Am_Object(&local_30);
      return;
    }
    if (local_28.type != 0xa001) {
      bVar1 = Am_Value::operator==(&local_28,-2);
      if (bVar1) {
        Am_Object::Set(&local_30,0x154,0,0);
      }
      goto LAB_0024a1f0;
    }
    Am_Object::operator=(&local_30,&local_28);
  } while( true );
}

Assistant:

Am_Define_Method_No_Static(Am_Object_Method, void, clear_save_pos_for_undo,
                           (Am_Object command_obj))
{
  Am_Object obj, parent;
  Am_Value value;
  obj = command_obj;
  while (true) {
    value = obj.Peek(Am_IMPLEMENTATION_PARENT);
    if (value.Valid()) {
      if (value.type != Am_OBJECT) {
        if (value == Am_MARKER_FOR_SCROLL_INC)
          obj.Set(Am_IMPLEMENTATION_PARENT, 0);
        break;
      }
    } else { // not valid
      break;
    }
    obj = value;
  }
}